

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O2

int av1_get_frame_buffer(void *cb_priv,size_t min_size,aom_codec_frame_buffer_t *fb)

{
  uint uVar1;
  uint8_t *memblk;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = -1;
  if (cb_priv != (void *)0x0) {
    uVar1 = *cb_priv;
    uVar3 = 0;
    uVar2 = 0;
    if (0 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    lVar5 = 0x10;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (*(int *)(*(long *)((long)cb_priv + 8) + lVar5) == 0) {
        uVar2 = uVar3 & 0xffffffff;
        break;
      }
      lVar5 = lVar5 + 0x18;
    }
    if ((uint)uVar2 != uVar1) {
      lVar5 = *(long *)((long)cb_priv + 8);
      lVar6 = uVar2 * 0x18;
      memblk = *(uint8_t **)(lVar5 + lVar6);
      if (*(ulong *)(lVar5 + 8 + lVar6) < min_size) {
        aom_free(memblk);
        memblk = (uint8_t *)aom_calloc(1,min_size);
        lVar5 = *(long *)((long)cb_priv + 8);
        *(uint8_t **)(lVar5 + lVar6) = memblk;
        if (memblk == (uint8_t *)0x0) {
          *(undefined8 *)(lVar5 + lVar6 + 8) = 0;
          return -1;
        }
        *(size_t *)(lVar5 + lVar6 + 8) = min_size;
      }
      fb->data = memblk;
      fb->size = *(size_t *)(lVar5 + 8 + lVar6);
      *(undefined4 *)(lVar5 + 0x10 + lVar6) = 1;
      fb->priv = (void *)(lVar5 + lVar6);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int av1_get_frame_buffer(void *cb_priv, size_t min_size,
                         aom_codec_frame_buffer_t *fb) {
  int i;
  InternalFrameBufferList *const int_fb_list =
      (InternalFrameBufferList *)cb_priv;
  if (int_fb_list == NULL) return -1;

  // Find a free frame buffer.
  for (i = 0; i < int_fb_list->num_internal_frame_buffers; ++i) {
    if (!int_fb_list->int_fb[i].in_use) break;
  }

  if (i == int_fb_list->num_internal_frame_buffers) return -1;

  if (int_fb_list->int_fb[i].size < min_size) {
    aom_free(int_fb_list->int_fb[i].data);
    // The data must be zeroed to fix a valgrind error from the C loop filter
    // due to access uninitialized memory in frame border. It could be
    // skipped if border were totally removed.
    int_fb_list->int_fb[i].data = (uint8_t *)aom_calloc(1, min_size);
    if (!int_fb_list->int_fb[i].data) {
      int_fb_list->int_fb[i].size = 0;
      return -1;
    }
    int_fb_list->int_fb[i].size = min_size;
  }

  fb->data = int_fb_list->int_fb[i].data;
  fb->size = int_fb_list->int_fb[i].size;
  int_fb_list->int_fb[i].in_use = 1;

  // Set the frame buffer's private data to point at the internal frame buffer.
  fb->priv = &int_fb_list->int_fb[i];
  return 0;
}